

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  string *val;
  WorkingMode WVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  long lVar6;
  pointer pMVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  PolicyStatus PVar11;
  int iVar12;
  uint uVar13;
  cmake *pcVar14;
  undefined8 extraout_RAX;
  long *plVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 extraout_RAX_00;
  ulong uVar16;
  char *pcVar17;
  char *__s;
  ulong uVar18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var19;
  element_type *peVar20;
  size_type *psVar21;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  undefined4 extraout_EDX_03;
  undefined4 extraout_EDX_04;
  PolicyID extraout_EDX_05;
  PolicyID extraout_EDX_06;
  PolicyID id;
  undefined7 in_register_00000011;
  pointer pMVar22;
  pointer pbVar23;
  undefined1 auVar24 [12];
  string expr;
  bool local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  cmListFileBacktrace local_130;
  undefined1 local_120 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string variable;
  GlobMessages globMessages;
  Glob g;
  
  pbVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileCommand.cxx"
                  ,0x2f5,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  uVar18 = CONCAT71(in_register_00000011,recurse) & 0xffffffff;
  variable._M_dataplus._M_p = (pointer)&variable.field_2;
  pcVar2 = pbVar23[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&variable,pcVar2,pcVar2 + pbVar23[1]._M_string_length);
  cmsys::Glob::Glob(&g);
  g.Recurse = (bool)(byte)uVar18;
  PVar11 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0009,false);
  if ((PVar11 < (REQUIRED_ALWAYS|WARN) & (byte)uVar18) != 0) {
    g.RecurseThroughSymlinks = SUB81(0x101L >> ((char)PVar11 * '\b' & 0x3fU),0);
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar14 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  pbVar23 = pbVar23 + 2;
  local_179 = pbVar23 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_179) {
    bVar10 = 1;
    id = extraout_EDX;
  }
  else {
    WVar1 = pcVar14->CurrentWorkingMode;
    local_120._20_4_ = 0;
    local_134 = 0;
    local_138 = 0;
    local_140 = 0;
    local_13c = (uint)CONCAT71(in_register_00000011,recurse);
    local_148 = args;
    do {
      iVar12 = std::__cxx11::string::compare((char *)pbVar23);
      if (iVar12 == 0) {
        val = pbVar23 + 1;
        if (val == (local_148->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
          expr._M_dataplus._M_p = (pointer)&expr.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&expr,"LIST_DIRECTORIES missing bool value.","");
          cmCommand::SetError(&this->super_cmCommand,&expr);
          goto LAB_002a54ba;
        }
        bVar9 = cmSystemTools::IsOn(val);
        if (bVar9) {
          g.ListDirs = true;
          g.RecurseListDirs = true;
          id = extraout_EDX_00;
        }
        else {
          bVar9 = cmSystemTools::IsOff(val);
          if (!bVar9) {
            expr._M_dataplus._M_p = (pointer)&expr.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&expr,"LIST_DIRECTORIES missing bool value.","");
            cmCommand::SetError(&this->super_cmCommand,&expr);
            goto LAB_002a54ba;
          }
          g.ListDirs = false;
          g.RecurseListDirs = false;
          id = extraout_EDX_01;
        }
        pbVar23 = pbVar23 + 2;
      }
      else {
        auVar24 = std::__cxx11::string::compare((char *)pbVar23);
        id = auVar24._8_4_;
        if (auVar24._0_4_ == 0) {
          pbVar23 = pbVar23 + 1;
          if ((char)uVar18 != '\0') {
            g.RecurseThroughSymlinks = true;
            local_120._20_4_ = (undefined4)CONCAT71(auVar24._1_7_,1);
            if (pbVar23 ==
                (local_148->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              expr._M_dataplus._M_p = (pointer)&expr.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&expr,
                         "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.","");
              cmCommand::SetError(&this->super_cmCommand,&expr);
              goto LAB_002a54ba;
            }
          }
        }
        else {
          iVar12 = std::__cxx11::string::compare((char *)pbVar23);
          if (iVar12 == 0) {
            if (pbVar23 + 1 ==
                (local_148->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              expr._M_dataplus._M_p = (pointer)&expr.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&expr,"GLOB requires a directory after the RELATIVE tag.","");
              cmCommand::SetError(&this->super_cmCommand,&expr);
              goto LAB_002a54ba;
            }
            cmsys::Glob::SetRelative(&g,pbVar23[1]._M_dataplus._M_p);
            pbVar23 = pbVar23 + 2;
            id = extraout_EDX_02;
            if (pbVar23 ==
                (local_148->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              expr._M_dataplus._M_p = (pointer)&expr.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&expr,"GLOB requires a glob expression after the directory.","");
              cmCommand::SetError(&this->super_cmCommand,&expr);
              goto LAB_002a54ba;
            }
          }
          else {
            auVar24 = std::__cxx11::string::compare((char *)pbVar23);
            if (auVar24._0_4_ == 0) {
              if (((local_134 & 1) == 0) && ((local_138 & 1) != 0)) {
                pcVar3 = (this->super_cmCommand).Makefile;
                expr._M_dataplus._M_p = (pointer)&expr.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&expr,
                           "CONFIGURE_DEPENDS flag was given after a glob expression was already evaluated."
                           ,"");
                cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&expr);
                auVar24._8_4_ = extraout_EDX_03;
                auVar24._0_8_ = &expr.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)expr._M_dataplus._M_p != &expr.field_2) {
                  operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
                  auVar24._8_4_ = extraout_EDX_04;
                  auVar24._0_8_ = extraout_RAX;
                }
              }
              id = auVar24._8_4_;
              if (WVar1 != NORMAL_MODE) {
                pcVar3 = (this->super_cmCommand).Makefile;
                expr._M_dataplus._M_p = (pointer)&expr.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&expr,
                           "CONFIGURE_DEPENDS is invalid for script and find package modes.","");
                cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&expr);
                goto LAB_002a54ba;
              }
              pbVar23 = pbVar23 + 1;
              local_134 = (uint)CONCAT71(auVar24._1_7_,1);
              if (pbVar23 ==
                  (local_148->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                expr._M_dataplus._M_p = (pointer)&expr.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&expr,
                           "GLOB requires a glob expression after CONFIGURE_DEPENDS.","");
                cmCommand::SetError(&this->super_cmCommand,&expr);
                goto LAB_002a54ba;
              }
            }
            else {
              expr._M_dataplus._M_p = (pointer)&expr.field_2;
              pcVar2 = (pbVar23->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&expr,pcVar2,pcVar2 + pbVar23->_M_string_length);
              bVar9 = cmsys::SystemTools::FileIsFullPath(pbVar23);
              if (!bVar9) {
                cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
                std::__cxx11::string::_M_assign((string *)&expr);
                if (expr._M_string_length == 0) {
                  std::__cxx11::string::_M_assign((string *)&expr);
                }
                else {
                  std::operator+(&local_168,"/",pbVar23);
                  std::__cxx11::string::_M_append((char *)&expr,(ulong)local_168._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    local_168.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              globMessages.
              super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              globMessages.
              super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              globMessages.
              super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmsys::Glob::FindFiles(&g,&expr,&globMessages);
              pMVar7 = globMessages.
                       super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (globMessages.
                  super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  globMessages.
                  super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
LAB_002a5036:
                if (((SUB81(uVar18,0) != false) && ((local_120._20_4_ & 1) == 0)) &&
                   (local_140 = local_140 & 0xff, g.FollowedSymlinkCount != 0)) {
                  local_140 = 1;
                }
                this_00 = cmsys::Glob::GetFiles_abi_cxx11_(&g);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &files,files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                           (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
                uVar13 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
                if ((local_134 & 1) != 0) {
                  pbVar4 = (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pbVar5 = (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                  if (pbVar4 != pbVar5) {
                    uVar16 = (long)pbVar5 - (long)pbVar4 >> 5;
                    lVar6 = 0x3f;
                    if (uVar16 != 0) {
                      for (; uVar16 >> lVar6 == 0; lVar6 = lVar6 + -1) {
                      }
                    }
                    std::
                    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                              (pbVar4,pbVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
                    std::
                    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                              (pbVar4,pbVar5);
                  }
                  _Var19 = std::
                           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                     ((this_00->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start,
                                      (this_00->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase(this_00,(iterator)_Var19._M_current,
                             (this_00->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
                  pcVar14 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
                  bVar8 = g.RecurseThroughSymlinks;
                  bVar9 = (&g.ListDirs)[uVar18 & 0xff];
                  pcVar17 = cmsys::Glob::GetRelative(&g);
                  __s = "";
                  if (pcVar17 != (char *)0x0) {
                    __s = cmsys::Glob::GetRelative(&g);
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_168,__s,(allocator<char> *)&local_e8);
                  cmMakefile::GetBacktrace((this->super_cmCommand).Makefile);
                  cmake::AddGlobCacheEntry
                            (pcVar14,SUB81(uVar18,0),(bool)(bVar9 & 1),
                             (bool)(bVar8 & (byte)local_13c),&local_168,&expr,this_00,&variable,
                             &local_130);
                  if (local_130.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_130.TopEntry.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                  uVar18 = (ulong)local_13c;
                  uVar13 = local_138;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    local_168.field_2._M_allocated_capacity + 1);
                    uVar13 = local_138;
                  }
                }
                pbVar23 = pbVar23 + 1;
                bVar9 = true;
                local_138 = uVar13;
              }
              else {
                bVar9 = false;
                pMVar22 = globMessages.
                          super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  pcVar3 = (this->super_cmCommand).Makefile;
                  if (pMVar22->type == cyclicRecursion) {
                    std::operator+(&local_e8,"Cyclic recursion detected while globbing for \'",
                                   pbVar23);
                    plVar15 = (long *)std::__cxx11::string::append((char *)&local_e8);
                    local_130.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)local_120;
                    peVar20 = (element_type *)(plVar15 + 2);
                    if ((element_type *)*plVar15 == peVar20) {
                      local_120._0_8_ = (peVar20->field_0).Bottom.State;
                      local_120._8_8_ = plVar15[3];
                    }
                    else {
                      local_120._0_8_ = (peVar20->field_0).Bottom.State;
                      local_130.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)*plVar15;
                    }
                    local_130.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar15[1];
                    *plVar15 = (long)peVar20;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    plVar15 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_130,
                                                 (ulong)(pMVar22->content)._M_dataplus._M_p);
                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                    psVar21 = (size_type *)(plVar15 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar15 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar21) {
                      local_168.field_2._M_allocated_capacity = *psVar21;
                      local_168.field_2._8_8_ = plVar15[3];
                    }
                    else {
                      local_168.field_2._M_allocated_capacity = *psVar21;
                      local_168._M_dataplus._M_p = (pointer)*plVar15;
                    }
                    local_168._M_string_length = plVar15[1];
                    *plVar15 = (long)psVar21;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_168);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if (local_130.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr != (element_type *)local_120) {
                      operator_delete(local_130.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_120._0_8_)->_M_t)._M_impl.field_0x1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                      operator_delete(local_e8._M_dataplus._M_p,
                                      local_e8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    std::operator+(&local_e8,"Error has occurred while globbing for \'",pbVar23);
                    plVar15 = (long *)std::__cxx11::string::append((char *)&local_e8);
                    local_130.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)local_120;
                    peVar20 = (element_type *)(plVar15 + 2);
                    if ((element_type *)*plVar15 == peVar20) {
                      local_120._0_8_ = (peVar20->field_0).Bottom.State;
                      local_120._8_8_ = plVar15[3];
                    }
                    else {
                      local_120._0_8_ = (peVar20->field_0).Bottom.State;
                      local_130.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)*plVar15;
                    }
                    local_130.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar15[1];
                    *plVar15 = (long)peVar20;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    plVar15 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_130,
                                                 (ulong)(pMVar22->content)._M_dataplus._M_p);
                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                    psVar21 = (size_type *)(plVar15 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar15 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar21) {
                      local_168.field_2._M_allocated_capacity = *psVar21;
                      local_168.field_2._8_8_ = plVar15[3];
                    }
                    else {
                      local_168.field_2._M_allocated_capacity = *psVar21;
                      local_168._M_dataplus._M_p = (pointer)*plVar15;
                    }
                    local_168._M_string_length = plVar15[1];
                    *plVar15 = (long)psVar21;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_168);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if (local_130.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr != (element_type *)local_120) {
                      operator_delete(local_130.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_120._0_8_)->_M_t)._M_impl.field_0x1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                      operator_delete(local_e8._M_dataplus._M_p,
                                      local_e8.field_2._M_allocated_capacity + 1);
                    }
                    bVar9 = true;
                  }
                  pMVar22 = pMVar22 + 1;
                } while (pMVar22 != pMVar7);
                uVar18 = (ulong)local_13c;
                if (!bVar9) goto LAB_002a5036;
                bVar9 = false;
              }
              std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
                        (&globMessages);
              id = extraout_EDX_05;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)expr._M_dataplus._M_p != &expr.field_2) {
                operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
                id = extraout_EDX_06;
              }
              if (!bVar9) goto LAB_002a54cc;
            }
          }
        }
      }
      local_179 = pbVar23 ==
                  (local_148->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    } while (!local_179);
    bVar10 = (byte)local_140 ^ 1;
  }
  if ((PVar11 < NEW) && ((bVar10 & 1) == 0)) {
    pcVar3 = (this->super_cmCommand).Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&expr,(cmPolicies *)0x9,id);
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&expr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p != &expr.field_2) {
      operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar4 = files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar23 = files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar18 = (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar6 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar23,pbVar4);
  }
  _Var19 = std::
           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&files,(iterator)_Var19._M_current,
             (iterator)
             files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pcVar3 = (this->super_cmCommand).Makefile;
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(&expr,&files,";");
  cmMakefile::AddDefinition(pcVar3,&variable,expr._M_dataplus._M_p);
LAB_002a54ba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
  }
LAB_002a54cc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmsys::Glob::~Glob(&g);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)variable._M_dataplus._M_p != &variable.field_2) {
    operator_delete(variable._M_dataplus._M_p,variable.field_2._M_allocated_capacity + 1);
  }
  return local_179;
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
                                      bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  std::vector<std::string> files;
  bool configureDepends = false;
  bool warnConfigureLate = false;
  bool warnFollowedSymlinks = false;
  const cmake::WorkingMode workingMode =
    this->Makefile->GetCMakeInstance()->GetWorkingMode();
  while (i != args.end()) {
    if (*i == "LIST_DIRECTORIES") {
      ++i; // skip LIST_DIRECTORIES
      if (i != args.end()) {
        if (cmSystemTools::IsOn(*i)) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmSystemTools::IsOff(*i)) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
        ++i;
      } else {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
    } else if (*i == "FOLLOW_SYMLINKS") {
      ++i; // skip FOLLOW_SYMLINKS
      if (recurse) {
        explicitFollowSymlinks = true;
        g.RecurseThroughSymlinksOn();
        if (i == args.end()) {
          this->SetError(
            "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.");
          return false;
        }
      }
    } else if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        this->SetError("GLOB requires a directory after the RELATIVE tag.");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        this->SetError("GLOB requires a glob expression after the directory.");
        return false;
      }
    } else if (*i == "CONFIGURE_DEPENDS") {
      // Generated build system depends on glob results
      if (!configureDepends && warnConfigureLate) {
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          "CONFIGURE_DEPENDS flag was given after a glob expression was "
          "already evaluated.");
      }
      if (workingMode != cmake::NORMAL_MODE) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "CONFIGURE_DEPENDS is invalid for script and find package modes.");
        return false;
      }
      configureDepends = true;
      ++i;
      if (i == args.end()) {
        this->SetError(
          "GLOB requires a glob expression after CONFIGURE_DEPENDS.");
        return false;
      }
    } else {
      std::string expr = *i;
      if (!cmsys::SystemTools::FileIsFullPath(*i)) {
        expr = this->Makefile->GetCurrentSourceDirectory();
        // Handle script mode
        if (!expr.empty()) {
          expr += "/" + *i;
        } else {
          expr = *i;
        }
      }

      cmsys::Glob::GlobMessages globMessages;
      g.FindFiles(expr, &globMessages);

      if (!globMessages.empty()) {
        bool shouldExit = false;
        for (cmsys::Glob::Message const& globMessage : globMessages) {
          if (globMessage.type == cmsys::Glob::cyclicRecursion) {
            this->Makefile->IssueMessage(
              MessageType::AUTHOR_WARNING,
              "Cyclic recursion detected while globbing for '" + *i + "':\n" +
                globMessage.content);
          } else {
            this->Makefile->IssueMessage(
              MessageType::FATAL_ERROR,
              "Error has occurred while globbing for '" + *i + "' - " +
                globMessage.content);
            shouldExit = true;
          }
        }
        if (shouldExit) {
          return false;
        }
      }

      if (recurse && !explicitFollowSymlinks &&
          g.GetFollowedSymlinkCount() != 0) {
        warnFollowedSymlinks = true;
      }

      std::vector<std::string>& foundFiles = g.GetFiles();
      files.insert(files.end(), foundFiles.begin(), foundFiles.end());

      if (configureDepends) {
        std::sort(foundFiles.begin(), foundFiles.end());
        foundFiles.erase(std::unique(foundFiles.begin(), foundFiles.end()),
                         foundFiles.end());
        this->Makefile->GetCMakeInstance()->AddGlobCacheEntry(
          recurse, (recurse ? g.GetRecurseListDirs() : g.GetListDirs()),
          (recurse ? g.GetRecurseThroughSymlinks() : false),
          (g.GetRelative() ? g.GetRelative() : ""), expr, foundFiles, variable,
          this->Makefile->GetBacktrace());
      } else {
        warnConfigureLate = true;
      }
      ++i;
    }
  }

  switch (status) {
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Correct behavior, yay!
      break;
    case cmPolicies::OLD:
    // Probably not really the expected behavior, but the author explicitly
    // asked for the old behavior... no warning.
    case cmPolicies::WARN:
      // Possibly unexpected old behavior *and* we actually traversed
      // symlinks without being explicitly asked to: warn the author.
      if (warnFollowedSymlinks) {
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
      }
      break;
  }

  std::sort(files.begin(), files.end());
  files.erase(std::unique(files.begin(), files.end()), files.end());
  this->Makefile->AddDefinition(variable, cmJoin(files, ";").c_str());
  return true;
}